

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O2

string * duckdb::FilterZeroAtEnd(string *__return_storage_ptr__,string *s)

{
  while ((s->_M_string_length != 0 && ((s->_M_dataplus)._M_p[s->_M_string_length - 1] == '\0'))) {
    ::std::__cxx11::string::pop_back();
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

static string FilterZeroAtEnd(string s) {
	while (!s.empty() && s.back() == '\0') {
		s.pop_back();
	}
	return s;
}